

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O3

double __thiscall
VarianceSwapsHestonAnalyticalPricer::uiTerm
          (VarianceSwapsHestonAnalyticalPricer *this,double t1,double t2)

{
  double dVar1;
  double dVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  complex<double> __r;
  complex<double> D1;
  complex<double> C1;
  double local_d8;
  double dStack_d0;
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  double local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  dVar3 = t2 - t1;
  dVar1 = qtildeTerm(this);
  dVar5 = wTerm(this,t1);
  dVar2 = cTerm(this,t1);
  dVar4 = 0.0;
  uVar8 = 0;
  functionCPrime(this,dVar3,0.0);
  local_28._4_4_ = extraout_XMM0_Db;
  local_28._0_4_ = extraout_XMM0_Da;
  local_58 = dVar4;
  uStack_50 = uVar8;
  local_48 = extraout_XMM0_Da;
  uStack_44 = extraout_XMM0_Db;
  local_28._8_8_ = dVar4;
  functionCSecond(this,dVar3,0.0);
  dVar4 = 0.0;
  uVar8 = 0;
  functionDPrime(this,dVar3,0.0);
  local_78 = dVar4;
  uStack_70 = uVar8;
  local_68 = extraout_XMM0_Da_01;
  uStack_64 = extraout_XMM0_Db_01;
  local_38._8_8_ = dVar4;
  functionDSecond(this,dVar3,0.0);
  dVar3 = dVar1 + dVar5;
  dVar5 = dVar3 * dVar3 + dVar5 + dVar5 + dVar1;
  dVar1 = local_78 * dVar5;
  local_88._8_4_ = SUB84(dVar1,0);
  local_88._0_8_ = (double)CONCAT44(uStack_64,local_68) * dVar5;
  local_88._12_4_ = (int)((ulong)dVar1 >> 0x20);
  std::complex<double>::operator*=((complex<double> *)local_88,(complex<double> *)local_38);
  uVar8 = local_88._0_8_;
  local_88._8_4_ = SUB84(local_58 + local_58,0);
  local_88._0_8_ = (double)CONCAT44(uStack_44,local_48) + (double)CONCAT44(uStack_44,local_48);
  local_88._12_4_ = (int)((ulong)(local_58 + local_58) >> 0x20);
  std::complex<double>::operator*=((complex<double> *)local_88,(complex<double> *)local_38);
  auVar6._8_8_ = ((double)local_88._0_8_ - (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02)
                 ) * dVar3;
  auVar6._0_8_ = uVar8;
  auVar7._8_4_ = SUB84(dVar2,0);
  auVar7._0_8_ = dVar2 * dVar2;
  auVar7._12_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar7 = divpd(auVar6,auVar7);
  local_88._8_8_ = local_28._8_8_;
  local_88._0_8_ = local_28._0_8_;
  std::complex<double>::operator*=((complex<double> *)local_88,(complex<double> *)local_28);
  local_d8 = auVar7._0_8_;
  dStack_d0 = auVar7._8_8_;
  return dStack_d0 + local_d8 +
         ((double)local_88._0_8_ - (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
}

Assistant:

double VarianceSwapsHestonAnalyticalPricer::
uiTerm(double t1, double t2) const {
    double delta = t2-t1,
           qtilde = qtildeTerm(),
           Wi = wTerm(t1),
           ci = cTerm(t1);
    std::complex<double> C1 = functionCPrime(delta,0.),
           C2 = functionCSecond(delta,0.),
           D1 = functionDPrime(delta,0.),
           D2 = functionDSecond(delta,0.);
    std::complex<double> firstTerm = (qtilde+2*Wi+(qtilde + Wi)*(qtilde + Wi)) 
                                        *D1*D1/(ci*ci),
                        secondTerm = (qtilde+Wi)*(2.0*C1*D1 - D2) / ci,
                        thirdTerm= C1*C1 - C2;
    std::complex<double> ui = firstTerm+secondTerm+thirdTerm;
    return ui.real();
}